

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::VisitPrimsRec
               (Path *root_abs_path,Prim *root,int32_t level,VisitPrimFunction visitor_fun,
               void *userdata,string *err)

{
  bool bVar1;
  ulong uVar2;
  PrimMeta *pPVar3;
  size_type sVar4;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *pvVar5;
  size_type sVar6;
  const_reference this;
  string *psVar7;
  const_reference pvVar8;
  pointer ppVar9;
  undefined1 local_370 [8];
  Path child_abs_path_1;
  Prim *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range3;
  string local_278 [32];
  fmt local_258 [32];
  undefined1 local_238 [8];
  Path child_abs_path;
  _Self local_160;
  iterator it;
  token nameTok;
  size_t i_1;
  const_reference local_120;
  ulong local_118;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  undefined1 local_d8 [8];
  string local_d0;
  allocator local_a9;
  string local_a8 [32];
  string local_88;
  undefined1 local_61;
  undefined1 local_60 [7];
  bool ret;
  string fun_error;
  string *err_local;
  void *userdata_local;
  VisitPrimFunction visitor_fun_local;
  int32_t level_local;
  Prim *root_local;
  Path *root_abs_path_local;
  
  fun_error.field_2._8_8_ = err;
  ::std::__cxx11::string::string((string *)local_60);
  local_61 = (*visitor_fun)(root_abs_path,root,level,userdata,(string *)local_60);
  if ((bool)local_61) {
    pPVar3 = Prim::metas(root);
    sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      (&pPVar3->primChildren);
    pvVar5 = Prim::children(root);
    sVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(pvVar5);
    if (sVar4 == sVar6) {
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
             *)&i);
      local_118 = 0;
      while( true ) {
        uVar2 = local_118;
        pvVar5 = Prim::children(root);
        sVar4 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(pvVar5);
        if (sVar4 <= uVar2) break;
        pvVar5 = Prim::children(root);
        this = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (pvVar5,local_118);
        psVar7 = Prim::element_name_abi_cxx11_(this);
        pvVar5 = Prim::children(root);
        local_120 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                              (pvVar5,local_118);
        ::std::
        map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
        ::emplace<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                  ((map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                    *)&i,psVar7,&local_120);
        local_118 = local_118 + 1;
      }
      nameTok.str_.field_2._8_8_ = 0;
      while( true ) {
        pPVar3 = Prim::metas(root);
        sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          (&pPVar3->primChildren);
        if (sVar4 <= (ulong)nameTok.str_.field_2._8_8_) break;
        pPVar3 = Prim::metas(root);
        pvVar8 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                           (&pPVar3->primChildren,nameTok.str_.field_2._8_8_);
        Token::Token((Token *)&it,pvVar8);
        psVar7 = Token::str_abi_cxx11_((Token *)&it);
        local_160._M_node =
             (_Base_ptr)
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                     *)&i,psVar7);
        child_abs_path._200_8_ =
             ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                    *)&i);
        bVar1 = ::std::operator!=(&local_160,(_Self *)&child_abs_path._valid);
        if (bVar1) {
          psVar7 = Token::str_abi_cxx11_((Token *)&it);
          Path::AppendPrim((Path *)local_238,root_abs_path,psVar7);
          ppVar9 = ::std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>
                   ::operator->(&local_160);
          bVar1 = VisitPrimsRec((Path *)local_238,ppVar9->second,level + 1,visitor_fun,userdata,
                                (string *)fun_error.field_2._8_8_);
          if (!bVar1) {
            root_abs_path_local._7_1_ = 0;
          }
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = !bVar1;
          Path::~Path((Path *)local_238);
          if (primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
            primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
          }
        }
        else {
          if (fun_error.field_2._8_8_ != 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_278,
                       "Prim name `{}` in `primChildren` metadatum not found in this Prim\'s children"
                       ,(allocator *)((long)&__range3 + 7));
            psVar7 = Token::str_abi_cxx11_((Token *)&it);
            fmt::format<std::__cxx11::string>
                      (local_258,(string *)local_278,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar7);
            ::std::__cxx11::string::operator+=
                      ((string *)fun_error.field_2._8_8_,(string *)local_258);
            ::std::__cxx11::string::~string((string *)local_258);
            ::std::__cxx11::string::~string(local_278);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
          }
          root_abs_path_local._7_1_ = 0;
          primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
        }
        Token::~Token((Token *)&it);
        if (primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
        goto LAB_0047d80e;
        nameTok.str_.field_2._8_8_ = nameTok.str_.field_2._8_8_ + 1;
      }
      primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
LAB_0047d80e:
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              *)&i);
      if (primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
      goto LAB_0047d93f;
    }
    else {
      pvVar5 = Prim::children(root);
      __end3 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(pvVar5);
      child = (Prim *)::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                         *)&child), bVar1) {
        child_abs_path_1._200_8_ =
             __gnu_cxx::
             __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
             ::operator*(&__end3);
        psVar7 = Prim::element_name_abi_cxx11_((Prim *)child_abs_path_1._200_8_);
        Path::AppendPrim((Path *)local_370,root_abs_path,psVar7);
        bVar1 = VisitPrimsRec((Path *)local_370,(Prim *)child_abs_path_1._200_8_,level + 1,
                              visitor_fun,userdata,(string *)fun_error.field_2._8_8_);
        if (!bVar1) {
          root_abs_path_local._7_1_ = 0;
        }
        primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
        primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = !bVar1;
        Path::~Path((Path *)local_370);
        if (primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
        goto LAB_0047d93f;
        __gnu_cxx::
        __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
        ::operator++(&__end3);
      }
    }
    root_abs_path_local._7_1_ = 1;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  else {
    uVar2 = ::std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (fun_error.field_2._8_8_ != 0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_a8,"Visit function returned an error for Prim {} (id {}). err = {}",&local_a9
                );
      Path::full_path_name_abi_cxx11_((string *)(local_d8 + 8),root_abs_path);
      local_d8 = (undefined1  [8])Prim::prim_id(root);
      fmt::format<std::__cxx11::string,long,std::__cxx11::string>
                (&local_88,(fmt *)local_a8,(string *)(local_d8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (long *)local_60,err);
      ::std::__cxx11::string::operator+=((string *)fun_error.field_2._8_8_,(string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)(local_d8 + 8));
      ::std::__cxx11::string::~string(local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    root_abs_path_local._7_1_ = 0;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
LAB_0047d93f:
  ::std::__cxx11::string::~string((string *)local_60);
  return (bool)(root_abs_path_local._7_1_ & 1);
}

Assistant:

bool VisitPrimsRec(const tinyusdz::Path &root_abs_path,
                   const tinyusdz::Prim &root, int32_t level,
                   VisitPrimFunction visitor_fun, void *userdata,
                   std::string *err) {
  std::string fun_error;
  bool ret = visitor_fun(root_abs_path, root, level, userdata, &fun_error);
  if (!ret) {
    if (fun_error.empty()) {
      // early termination request.
      DCOUT("Early termination requested");
    } else {
      if (err) {
        (*err) += fmt::format(
            "Visit function returned an error for Prim {} (id {}). err = {}",
            root_abs_path.full_path_name(), root.prim_id(), fun_error);
      }
    }
    return false;
  }

  // if `primChildren` is available, use it
  if (root.metas().primChildren.size() == root.children().size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < root.children().size(); i++) {
      primNameTable.emplace(root.children()[i].element_name(),
                            &root.children()[i]);
    }

    for (size_t i = 0; i < root.metas().primChildren.size(); i++) {
      value::token nameTok = root.metas().primChildren[i];
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        const Path child_abs_path = root_abs_path.AppendPrim(nameTok.str());
        if (!VisitPrimsRec(child_abs_path, *it->second, level + 1, visitor_fun,
                           userdata, err)) {
          return false;
        }
      } else {
        if (err) {
          (*err) += fmt::format(
              "Prim name `{}` in `primChildren` metadatum not found in this "
              "Prim's children",
              nameTok.str());
        }
        return false;
      }
    }

  } else {
    for (const auto &child : root.children()) {
      const Path child_abs_path =
          root_abs_path.AppendPrim(child.element_name());
      if (!VisitPrimsRec(child_abs_path, child, level + 1, visitor_fun,
                         userdata, err)) {
        return false;
      }
    }
  }

  return true;
}